

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O0

FT_Error T1_Get_Track_Kerning(FT_Face face,FT_Fixed ptsize,FT_Int degree,FT_Fixed *kerning)

{
  FT_String *pFVar1;
  int *piVar2;
  FT_Long FVar3;
  AFM_TrackKern tk;
  FT_UInt i;
  AFM_FontInfo fi;
  FT_Fixed *kerning_local;
  FT_Int degree_local;
  FT_Fixed ptsize_local;
  FT_Face face_local;
  
  pFVar1 = face[3].style_name;
  if (pFVar1 == (FT_String *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    for (tk._4_4_ = 0; tk._4_4_ < *(uint *)(pFVar1 + 0x40); tk._4_4_ = tk._4_4_ + 1) {
      piVar2 = (int *)(*(long *)(pFVar1 + 0x38) + (ulong)tk._4_4_ * 0x28);
      if (*piVar2 == degree) {
        if (ptsize < *(long *)(piVar2 + 2)) {
          *kerning = *(FT_Fixed *)(piVar2 + 4);
        }
        else if (*(long *)(piVar2 + 6) < ptsize) {
          *kerning = *(FT_Fixed *)(piVar2 + 8);
        }
        else {
          FVar3 = FT_MulDiv(ptsize - *(long *)(piVar2 + 2),
                            *(long *)(piVar2 + 8) - *(long *)(piVar2 + 4),
                            *(long *)(piVar2 + 6) - *(long *)(piVar2 + 2));
          *kerning = FVar3 + *(long *)(piVar2 + 4);
        }
      }
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Track_Kerning( FT_Face    face,
                        FT_Fixed   ptsize,
                        FT_Int     degree,
                        FT_Fixed*  kerning )
  {
    AFM_FontInfo  fi = (AFM_FontInfo)( (T1_Face)face )->afm_data;
    FT_UInt       i;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < fi->NumTrackKern; i++ )
    {
      AFM_TrackKern  tk = fi->TrackKerns + i;


      if ( tk->degree != degree )
        continue;

      if ( ptsize < tk->min_ptsize )
        *kerning = tk->min_kern;
      else if ( ptsize > tk->max_ptsize )
        *kerning = tk->max_kern;
      else
      {
        *kerning = FT_MulDiv( ptsize - tk->min_ptsize,
                              tk->max_kern - tk->min_kern,
                              tk->max_ptsize - tk->min_ptsize ) +
                   tk->min_kern;
      }
    }

    return FT_Err_Ok;
  }